

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_load_image_from_file_data_to_buffer
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,rf_int dst_size,
          rf_desired_channels channels,rf_allocator temp_allocator)

{
  rf_source_location source_location;
  rf_source_location rVar1;
  rf_allocator_args rVar2;
  stbi_uc *__src;
  size_t __n;
  long in_FS_OFFSET;
  int img_bpp;
  int img_height;
  int img_width;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  stbi_uc *local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  uint uStack_7c;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (src == (void *)0x0 || src_size < 1) {
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_40 = "rf_load_image_from_file_data_to_buffer";
    local_38 = 0x3c4b;
    rf_log_impl(8,0x172cad,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file_data_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c4b;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->format = 0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  }
  else {
    __return_storage_ptr__->format = 0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
    img_width = 0;
    img_height = 0;
    img_bpp = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    *(void **)(in_FS_OFFSET + -0x430) = temp_allocator.user_data;
    *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = temp_allocator.allocator_proc;
    __src = stbi_load_from_memory
                      ((stbi_uc *)src,(int)src_size,&img_width,&img_height,&img_bpp,channels);
    *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
    if (__src == (stbi_uc *)0x0) {
      local_a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_a0 = "rf_load_image_from_file_data_to_buffer";
      local_98 = 0x3c71;
      source_location.proc_name._0_4_ = 0x172c86;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3c71;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }"
                  ,7,(ulong)(uint)img_width,(ulong)(uint)img_height,(ulong)(uint)img_bpp);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file_data_to_buffer";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c71;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 7;
    }
    else {
      __n = (size_t)(img_height * img_width * img_bpp);
      if (dst_size < (long)__n) {
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_58 = "rf_load_image_from_file_data_to_buffer";
        local_50 = 0x3c6d;
        rf_log_impl(8,0x172ccb,(char *)0x1);
        *(char **)(in_FS_OFFSET + -0x450) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(in_FS_OFFSET + -0x448) = "rf_load_image_from_file_data_to_buffer";
        *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3c6d;
        *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
      }
      else {
        __return_storage_ptr__->data = dst;
        __return_storage_ptr__->width = img_width;
        __return_storage_ptr__->height = img_height;
        __return_storage_ptr__->valid = true;
        if (img_bpp - 1U < 4) {
          __return_storage_ptr__->format =
               *(rf_pixel_format *)(&DAT_00170080 + (ulong)(img_bpp - 1U) * 4);
        }
        memcpy(dst,__src,__n);
      }
      local_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_70 = "rf_load_image_from_file_data_to_buffer";
      uStack_88 = 0;
      local_68 = 0x3c6f;
      local_80 = 0;
      rVar1.proc_name._0_4_ = 0x172c86;
      rVar1.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar1.proc_name._4_4_ = 0;
      rVar1.line_in_file = 0x3c6f;
      rVar2.size_to_allocate_or_reallocate = 0;
      rVar2.pointer_to_free_or_realloc = __src;
      rVar2._16_8_ = (ulong)uStack_7c << 0x20;
      local_90 = __src;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar1,RF_AM_FREE,rVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_file_data_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size, rf_desired_channels channels, rf_allocator temp_allocator)
{
    if (src == NULL || src_size <= 0) { RF_LOG_ERROR(RF_BAD_ARGUMENT, "Argument `image` was invalid."); return (rf_image){0}; }

    rf_image result = {0};

    int img_width  = 0;
    int img_height = 0;
    int img_bpp    = 0;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    void* output_buffer = stbi_load_from_memory(src, src_size, &img_width, &img_height, &img_bpp, channels);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    if (output_buffer)
    {
        int output_buffer_size = img_width * img_height * img_bpp;

        if (dst_size >= output_buffer_size)
        {
            result.data   = dst;
            result.width  = img_width;
            result.height = img_height;
            result.valid  = true;

            switch (img_bpp)
            {
                case 1: result.format = RF_UNCOMPRESSED_GRAYSCALE; break;
                case 2: result.format = RF_UNCOMPRESSED_GRAY_ALPHA; break;
                case 3: result.format = RF_UNCOMPRESSED_R8G8B8; break;
                case 4: result.format = RF_UNCOMPRESSED_R8G8B8A8; break;
                default: break;
            }

            memcpy(dst, output_buffer, output_buffer_size);
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Buffer is not big enough", img_width, img_height, img_bpp);

        RF_FREE(temp_allocator, output_buffer);
    }
    else RF_LOG_ERROR(RF_STBI_FAILED, "File format not supported or could not be loaded. STB Image returned { x: %d, y: %d, channels: %d }", img_width, img_height, img_bpp);

    return result;
}